

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread_test.cpp
# Opt level: O3

void * test_thread_nonjoinable_func(void *data)

{
  uint uVar1;
  
  is_threads_working = 1;
  if (thread_to_wakes == '\x01') {
    uVar1 = 0x65;
    do {
      p_uthread_sleep(10);
      *(int *)data = *data + 1;
      p_uthread_yield();
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  is_threads_working = 0;
  p_uthread_exit(0);
  return (void *)0x0;
}

Assistant:

static void * test_thread_nonjoinable_func (void *data)
{
	pint *counter = static_cast < pint * > (data);

	is_threads_working = TRUE;

	for (int i = thread_to_wakes; i > 0; --i) {
		p_uthread_sleep (10);
		++(*counter);
		p_uthread_yield ();
	}

	is_threads_working = FALSE;

	p_uthread_exit (0);

	return NULL;
}